

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnView::resizeEvent(QColumnView *this,QResizeEvent *event)

{
  int iVar1;
  int iVar2;
  QColumnViewPrivate *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  QScrollBar *pQVar6;
  QScrollBar *this_01;
  
  this_00 = *(QColumnViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QColumnViewPrivate::doLayout(this_00);
  QColumnViewPrivate::updateScrollbars(this_00);
  bVar3 = QWidget::isRightToLeft((QWidget *)this);
  if ((!bVar3) &&
     (iVar1 = *(int *)(event + 0x18), iVar2 = *(int *)(event + 0x10), iVar1 - iVar2 < 0)) {
    pQVar6 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    if ((((pQVar6->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0) {
      pQVar6 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar4 = QAbstractSlider::value(&pQVar6->super_QAbstractSlider);
      pQVar6 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar5 = QAbstractSlider::maximum(&pQVar6->super_QAbstractSlider);
      if (iVar4 == iVar5) {
        pQVar6 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
        this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
        iVar4 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
        QAbstractSlider::setMaximum(&pQVar6->super_QAbstractSlider,(iVar1 - iVar2) + iVar4);
      }
    }
  }
  QAbstractItemView::resizeEvent((QAbstractItemView *)this,event);
  return;
}

Assistant:

void QColumnView::resizeEvent(QResizeEvent *event)
{
    Q_D(QColumnView);
    d->doLayout();
    d->updateScrollbars();
    if (!isRightToLeft()) {
        int diff = event->oldSize().width() - event->size().width();
        if (diff < 0 && horizontalScrollBar()->isVisible()
            && horizontalScrollBar()->value() == horizontalScrollBar()->maximum()) {
            horizontalScrollBar()->setMaximum(horizontalScrollBar()->maximum() + diff);
        }
    }
    QAbstractItemView::resizeEvent(event);
}